

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int xm_create_context_safe(xm_context_t **ctxp,char *moddata,size_t moddata_length,uint32_t rate)

{
  ushort uVar1;
  xm_channel_context_t *pxVar2;
  uint uVar3;
  size_t __size;
  xm_context_t *ctx_00;
  xm_channel_context_t *pxVar4;
  uint32_t in_ECX;
  undefined8 *in_RDI;
  int ret_1;
  xm_channel_context_t *ch;
  uint8_t i;
  int ret;
  xm_context_t *ctx;
  char *mempool;
  size_t bytes_needed;
  char *in_stack_00000238;
  size_t in_stack_00000240;
  char *in_stack_00000248;
  xm_context_t *in_stack_00000250;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  byte local_45;
  int local_4;
  
  uVar3 = xm_check_sanity_preload
                    ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x102b26)
  ;
  if (uVar3 == 0) {
    __size = xm_get_memory_needed_for_context(mempool,(size_t)ctx);
    ctx_00 = (xm_context_t *)malloc(__size);
    if ((ctx_00 == (xm_context_t *)0x0) && (__size != 0)) {
      fprintf(_stderr,"%s(): call to malloc() failed, returned %p\n","xm_create_context_safe",0);
      fflush(_stderr);
      local_4 = 2;
    }
    else {
      memset(ctx_00,0,__size);
      *in_RDI = ctx_00;
      ctx_00->ctx_size = __size;
      ctx_00->rate = in_ECX;
      pxVar4 = (xm_channel_context_t *)
               xm_load_module(in_stack_00000250,in_stack_00000248,in_stack_00000240,
                              in_stack_00000238);
      ctx_00->channels = pxVar4;
      uVar1 = (ctx_00->module).num_channels;
      ctx_00->global_volume = 1.0;
      ctx_00->amplification = 0.25;
      ctx_00->volume_ramp = 0.0078125;
      for (local_45 = 0; (ushort)local_45 < (ctx_00->module).num_channels; local_45 = local_45 + 1)
      {
        pxVar2 = ctx_00->channels;
        pxVar2[(int)(uint)local_45].ping = true;
        pxVar2[(int)(uint)local_45].vibrato_waveform = XM_SINE_WAVEFORM;
        pxVar2[(int)(uint)local_45].vibrato_waveform_retrigger = true;
        pxVar2[(int)(uint)local_45].tremolo_waveform = XM_SINE_WAVEFORM;
        pxVar2[(int)(uint)local_45].tremolo_waveform_retrigger = true;
        pxVar2[(int)(uint)local_45].fadeout_volume = 1.0;
        pxVar2[(int)(uint)local_45].volume_envelope_volume = 1.0;
        pxVar2[(int)(uint)local_45].volume = 1.0;
        pxVar2[(int)(uint)local_45].panning_envelope_panning = 0.5;
        pxVar2[(int)(uint)local_45].panning = 0.5;
        pxVar2[(int)(uint)local_45].actual_volume[0] = 0.0;
        pxVar2[(int)(uint)local_45].actual_volume[1] = 0.0;
      }
      ctx_00->row_loop_count = (uint8_t *)(pxVar4 + uVar1);
      uVar3 = xm_check_sanity_postload(ctx_00);
      if (uVar3 == 0) {
        local_4 = 0;
      }
      else {
        fprintf(_stderr,"%s(): xm_check_sanity_postload() returned %i, module is not safe to play\n"
                ,"xm_create_context_safe",(ulong)uVar3);
        fflush(_stderr);
        xm_free_context((xm_context_t *)0x102e37);
        local_4 = 1;
      }
    }
  }
  else {
    fprintf(_stderr,"%s(): xm_check_sanity_preload() returned %i, module is not safe to load\n",
            "xm_create_context_safe",(ulong)uVar3);
    fflush(_stderr);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int xm_create_context_safe(xm_context_t** ctxp, const char* moddata, size_t moddata_length, uint32_t rate) {
	size_t bytes_needed;
	char* mempool;
	xm_context_t* ctx;

	if(XM_DEFENSIVE) {
		int ret;
		if((ret = xm_check_sanity_preload(moddata, moddata_length))) {
			DEBUG("xm_check_sanity_preload() returned %i, module is not safe to load", ret);
			return 1;
		}
	}

	bytes_needed = xm_get_memory_needed_for_context(moddata, moddata_length);
	mempool = malloc(bytes_needed);
	if(mempool == NULL && bytes_needed > 0) {
		/* malloc() failed, trouble ahead */
		DEBUG("call to malloc() failed, returned %p", (void*)mempool);
		return 2;
	}

	/* Initialize most of the fields to 0, 0.f, NULL or false depending on type */
	memset(mempool, 0, bytes_needed);

	ctx = (*ctxp = (xm_context_t*)mempool);
	ctx->ctx_size = bytes_needed; /* Keep original requested size for xmconvert */
	mempool += sizeof(xm_context_t);

	ctx->rate = rate;
	mempool = xm_load_module(ctx, moddata, moddata_length, mempool);

	ctx->channels = (xm_channel_context_t*)mempool;
	mempool += ctx->module.num_channels * sizeof(xm_channel_context_t);

	ctx->global_volume = 1.f;
	ctx->amplification = .25f; /* XXX: some bad modules may still clip. Find out something better. */

#if XM_RAMPING
	ctx->volume_ramp = (1.f / 128.f);
#endif

	for(uint8_t i = 0; i < ctx->module.num_channels; ++i) {
		xm_channel_context_t* ch = ctx->channels + i;

		ch->ping = true;
		ch->vibrato_waveform = XM_SINE_WAVEFORM;
		ch->vibrato_waveform_retrigger = true;
		ch->tremolo_waveform = XM_SINE_WAVEFORM;
		ch->tremolo_waveform_retrigger = true;

		ch->volume = ch->volume_envelope_volume = ch->fadeout_volume = 1.0f;
		ch->panning = ch->panning_envelope_panning = .5f;
		ch->actual_volume[0] = .0f;
		ch->actual_volume[1] = .0f;
	}

	ctx->row_loop_count = (uint8_t*)mempool;
	mempool += ctx->module.length * MAX_NUM_ROWS * sizeof(uint8_t);

	if(XM_DEFENSIVE) {
		int ret;
		if((ret = xm_check_sanity_postload(ctx))) {
			DEBUG("xm_check_sanity_postload() returned %i, module is not safe to play", ret);
			xm_free_context(ctx);
			return 1;
		}
	}

	return 0;
}